

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O2

int xe::getEnumValue(char *enumName,EnumMapEntry *entries,int numEntries,char *name)

{
  deUint32 dVar1;
  deBool dVar2;
  TestResultParseError *this;
  ulong uVar3;
  ulong uVar4;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  dVar1 = deStringHash(name);
  uVar4 = 0;
  uVar3 = (ulong)(uint)numEntries;
  if (numEntries < 1) {
    uVar3 = uVar4;
  }
  do {
    if (uVar3 * 0x18 - uVar4 == 0) {
      this = (TestResultParseError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"Could not map \'",&local_b1);
      std::operator+(&local_90,&local_b0,name);
      std::operator+(&local_70,&local_90,"\' to ");
      std::operator+(&local_50,&local_70,enumName);
      TestResultParseError::TestResultParseError(this,&local_50);
      __cxa_throw(this,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(deUint32 *)((long)&entries->hash + uVar4) == dVar1) {
      dVar2 = deStringEqual(*(char **)((long)&entries->name + uVar4),name);
      if (dVar2 != 0) {
        return *(int *)((long)&entries->value + uVar4);
      }
    }
    uVar4 = uVar4 + 0x18;
  } while( true );
}

Assistant:

static inline int getEnumValue (const char* enumName, const EnumMapEntry* entries, int numEntries, const char* name)
{
	deUint32 hash = deStringHash(name);

	for (int ndx = 0; ndx < numEntries; ndx++)
	{
		if (entries[ndx].hash == hash && deStringEqual(entries[ndx].name, name))
			return entries[ndx].value;
	}

	throw TestResultParseError(string("Could not map '") + name + "' to " + enumName);
}